

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O0

void libcmepoll_LTX_polling_function(CMtrans_services_conflict svc,void *client_data)

{
  int iVar1;
  CManager in_RSI;
  select_data_ptr *in_RDI;
  select_data_ptr sd;
  int in_stack_000001e0;
  int in_stack_000001e4;
  select_data_ptr in_stack_000001e8;
  CMtrans_services_conflict in_stack_000001f0;
  long local_18;
  
  local_18 = *(long *)in_RSI;
  if (local_18 == 0) {
    init_select_data((CMtrans_services_conflict)sd,in_RDI,in_RSI);
    local_18 = *(long *)in_RSI;
  }
  if ((*(long *)(local_18 + 0x30) != 0) &&
     (iVar1 = (*(code *)in_RDI[0x17])
                        (*(undefined8 *)(local_18 + 0x30),
                         "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
                         ,0x3f1), iVar1 == 0)) {
    printf("%s:%u: failed assertion `%s\'\n",
           "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
           ,0x3f1,"CM_LOCKED(svc, sd->cm)");
    abort();
  }
  socket_select(in_stack_000001f0,in_stack_000001e8,in_stack_000001e4,in_stack_000001e0);
  return;
}

Assistant:

extern void
libcmepoll_LTX_polling_function(CMtrans_services svc, void *client_data)
{
    select_data_ptr sd = *((select_data_ptr *)client_data);
    if (sd == NULL) {
	init_select_data(svc, (select_data_ptr*)client_data, (CManager)NULL);
	sd = *((select_data_ptr *)client_data);
    }
    if (sd->cm) {
	/* assert CM is locked */
	assert(CM_LOCKED(svc, sd->cm));
    }
    socket_select(svc, sd, 0, 0); /* no blocking, immediate timeout */
}